

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O0

void adjust_heap(uint64_t **first,size_t holeIndex,size_t len,uint64_t *value)

{
  int iVar1;
  uint64_t **ppuVar2;
  long lVar3;
  size_t in_RCX;
  ulong in_RDX;
  uint64_t **in_RSI;
  long in_RDI;
  size_t secondChild;
  size_t topIndex;
  undefined8 local_30;
  uint64_t **ppuVar4;
  
  local_30 = in_RSI;
  while (local_30 < (uint64_t **)(in_RDX - 1 >> 1)) {
    ppuVar2 = (uint64_t **)(((long)local_30 + 1U) * 2);
    ppuVar4 = local_30;
    iVar1 = FHeapCompare(*(uint64_t **)(in_RDI + ((long)local_30 + 1U) * 0x10),
                         *(uint64_t **)(in_RDI + ((long)ppuVar2 - 1U) * 8));
    local_30 = ppuVar2;
    if (iVar1 != 0) {
      local_30 = (uint64_t **)((long)ppuVar2 - 1);
    }
    *(undefined8 *)(in_RDI + (long)ppuVar4 * 8) = *(undefined8 *)(in_RDI + (long)local_30 * 8);
  }
  if (((in_RDX & 1) == 0) && (local_30 == (uint64_t **)(in_RDX - 2 >> 1))) {
    lVar3 = ((long)local_30 + 1U) * 2;
    *(undefined8 *)(in_RDI + (long)local_30 * 8) = *(undefined8 *)(in_RDI + (lVar3 + -1) * 8);
    local_30 = (uint64_t **)(lVar3 + -1);
  }
  intern_push_heap(local_30,in_RDX,in_RCX,(uint64_t *)in_RSI);
  return;
}

Assistant:

static inline void
adjust_heap (uint64_t** first, size_t holeIndex, size_t len, uint64_t* value)
{
    const size_t topIndex    = holeIndex;
    size_t       secondChild = holeIndex;

    while (secondChild < (len - 1) / 2)
    {
        secondChild = 2 * (secondChild + 1);
        if (FHeapCompare (*(first + secondChild), *(first + (secondChild - 1))))
            --secondChild;
        *(first + holeIndex) = *(first + secondChild);
        holeIndex            = secondChild;
    }

    if ((len & 1) == 0 && secondChild == (len - 2) / 2)
    {
        secondChild          = 2 * (secondChild + 1);
        *(first + holeIndex) = *(first + (secondChild - 1));
        holeIndex            = secondChild - 1;
    }

    intern_push_heap (first, holeIndex, topIndex, value);
}